

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-active.c
# Opt level: O2

int run_test_active(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_b0;
  uv_timer_t timer;
  
  puVar2 = uv_default_loop();
  iVar1 = uv_timer_init(puVar2,&timer);
  if (iVar1 == 0) {
    iVar1 = uv_is_active((uv_handle_t *)&timer);
    if (iVar1 == 0) {
      iVar1 = uv_is_closing((uv_handle_t *)&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
        if (iVar1 == 0) {
          iVar1 = uv_is_active((uv_handle_t *)&timer);
          if (iVar1 == 1) {
            iVar1 = uv_is_closing((uv_handle_t *)&timer);
            if (iVar1 == 0) {
              iVar1 = uv_timer_stop(&timer);
              if (iVar1 == 0) {
                iVar1 = uv_is_active((uv_handle_t *)&timer);
                if (iVar1 == 0) {
                  iVar1 = uv_is_closing((uv_handle_t *)&timer);
                  if (iVar1 == 0) {
                    iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
                    if (iVar1 == 0) {
                      iVar1 = uv_is_active((uv_handle_t *)&timer);
                      if (iVar1 == 1) {
                        iVar1 = uv_is_closing((uv_handle_t *)&timer);
                        if (iVar1 == 0) {
                          uv_close((uv_handle_t *)&timer,close_cb);
                          iVar1 = uv_is_active((uv_handle_t *)&timer);
                          if (iVar1 == 0) {
                            iVar1 = uv_is_closing((uv_handle_t *)&timer);
                            if (iVar1 == 1) {
                              puVar2 = uv_default_loop();
                              iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
                              if (iVar1 == 0) {
                                if (close_cb_called == 1) {
                                  puVar2 = uv_default_loop();
                                  uv_walk(puVar2,close_walk_cb,(void *)0x0);
                                  uv_run(puVar2,UV_RUN_DEFAULT);
                                  puVar2 = uv_default_loop();
                                  iVar1 = uv_loop_close(puVar2);
                                  if (iVar1 == 0) {
                                    return 0;
                                  }
                                  pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                                  uStack_b0 = 0x52;
                                }
                                else {
                                  pcVar3 = "close_cb_called == 1";
                                  uStack_b0 = 0x50;
                                }
                              }
                              else {
                                pcVar3 = "r == 0";
                                uStack_b0 = 0x4e;
                              }
                            }
                            else {
                              pcVar3 = "1 == uv_is_closing((uv_handle_t*) &timer)";
                              uStack_b0 = 0x4b;
                            }
                          }
                          else {
                            pcVar3 = "0 == uv_is_active((uv_handle_t*) &timer)";
                            uStack_b0 = 0x4a;
                          }
                        }
                        else {
                          pcVar3 = "0 == uv_is_closing((uv_handle_t*) &timer)";
                          uStack_b0 = 0x46;
                        }
                      }
                      else {
                        pcVar3 = "1 == uv_is_active((uv_handle_t*) &timer)";
                        uStack_b0 = 0x45;
                      }
                    }
                    else {
                      pcVar3 = "r == 0";
                      uStack_b0 = 0x43;
                    }
                  }
                  else {
                    pcVar3 = "0 == uv_is_closing((uv_handle_t*) &timer)";
                    uStack_b0 = 0x40;
                  }
                }
                else {
                  pcVar3 = "0 == uv_is_active((uv_handle_t*) &timer)";
                  uStack_b0 = 0x3f;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_b0 = 0x3d;
              }
            }
            else {
              pcVar3 = "0 == uv_is_closing((uv_handle_t*) &timer)";
              uStack_b0 = 0x3a;
            }
          }
          else {
            pcVar3 = "1 == uv_is_active((uv_handle_t*) &timer)";
            uStack_b0 = 0x39;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_b0 = 0x37;
        }
      }
      else {
        pcVar3 = "0 == uv_is_closing((uv_handle_t*) &timer)";
        uStack_b0 = 0x34;
      }
    }
    else {
      pcVar3 = "0 == uv_is_active((uv_handle_t*) &timer)";
      uStack_b0 = 0x33;
    }
  }
  else {
    pcVar3 = "r == 0";
    uStack_b0 = 0x30;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-active.c"
          ,uStack_b0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(active) {
  int r;
  uv_timer_t timer;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  /* uv_is_active() and uv_is_closing() should always return either 0 or 1. */
  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_stop(&timer);
  ASSERT(r == 0);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_timer_start(&timer, timer_cb, 1000, 0);
  ASSERT(r == 0);

  ASSERT(1 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(0 == uv_is_closing((uv_handle_t*) &timer));

  uv_close((uv_handle_t*) &timer, close_cb);

  ASSERT(0 == uv_is_active((uv_handle_t*) &timer));
  ASSERT(1 == uv_is_closing((uv_handle_t*) &timer));

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}